

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorting.c
# Opt level: O0

int main(void)

{
  Vector *pVVar1;
  uint max;
  uint min;
  Vector *vector;
  int i;
  int functionsSize;
  SortFunctionPair functions [5];
  Number local_28 [2];
  int v [6];
  
  v[5] = 0;
  local_28[0] = 0x48;
  local_28[1] = 0x1d;
  v[0] = 0x26;
  v[1] = 0x16;
  v[2] = 0x3c;
  v[3] = 2;
  memcpy(&i,&PTR_Sort_Selection_Vector_00104d80,0x78);
  printf("Hello! Let\'s sort this out!\n");
  for (vector._0_4_ = 0; (int)vector < 5; vector._0_4_ = (int)vector + 1) {
    printf("\nRunning %s\n",functions[(int)vector].sortRangeFunction);
    pVVar1 = Vector_createFromArrayCopy(local_28,6);
    printf("Initial Array:\n");
    Vector_print(pVVar1);
    (**(code **)(&i + (long)(int)vector * 6))(pVVar1);
    printf("Sorted Array:\n");
    Vector_print(pVVar1);
    Vector_destroy(pVVar1);
  }
  printf("\nLet\'s sort just part of the vector, from index %1d to %1d\n",1,4);
  for (vector._0_4_ = 0; (int)vector < 5; vector._0_4_ = (int)vector + 1) {
    printf("\nRunning %s\n",functions[(int)vector].sortRangeFunction);
    pVVar1 = Vector_createFromArrayCopy(local_28,6);
    printf("Initial Array:\n");
    Vector_print(pVVar1);
    (*functions[(int)vector].sortFunction)(pVVar1);
    printf("Sorted Array:\n");
    Vector_print(pVVar1);
    Vector_destroy(pVVar1);
  }
  printf("\nRunning Insertion sort using Void function\n");
  pVVar1 = Vector_createFromArrayCopy(local_28,6);
  printf("Initial Array:\n");
  Vector_print(pVVar1);
  Sort_Insertion_Range(pVVar1->a,0,5,4,lessFunc,print);
  printf("Sorted Array:\n");
  Vector_print(pVVar1);
  Vector_destroy(pVVar1);
  return 0;
}

Assistant:

int main() {
#if OS_WIN
    int input = 0;
#endif
    int v[] = {72, 29, 38, 22, 60, 2};

    SortFunctionPair functions[] = {
            {Sort_Selection_Vector, Sort_Selection_Vector_Range, "Selection Sort"},
            {Sort_Insertion_Vector, Sort_Insertion_Vector_Range, "Insertion Sort"},
            {Sort_Bubble_Vector,    Sort_Bubble_Vector_Range,    "Bubble Sort"},
            {Sort_Heap_Vector,      Sort_Heap_Vector_Range,      "Heap Sort"},
            {Sort_Quick_Vector,     Sort_Quick_Vector_Range,     "Quick Sort"}
    };
    int functionsSize = 5;
    int i;
    Vector* vector;
    unsigned int min = 1, max = 4;

    printf("Hello! Let's sort this out!\n");

    for (i = 0; i < functionsSize; ++i) {
        printf("\nRunning %s\n", functions[i].name);
        vector = Vector_createFromArrayCopy(v, 6);

        printf("Initial Array:\n");
        Vector_print(vector);

        (*functions[i].sortFunction)(vector);

        printf("Sorted Array:\n");
        Vector_print(vector);

        Vector_destroy(vector);
    }

    printf("\nLet's sort just part of the vector, from index %1d to %1d\n", min,
           max);

    for (i = 0; i < functionsSize; ++i) {
        printf("\nRunning %s\n", functions[i].name);
        vector = Vector_createFromArrayCopy(v, 6);

        printf("Initial Array:\n");
        Vector_print(vector);

        (*functions[i].sortRangeFunction)(vector, min, max);

        printf("Sorted Array:\n");
        Vector_print(vector);

        Vector_destroy(vector);
    }

    printf("\nRunning Insertion sort using Void function\n");
    vector = Vector_createFromArrayCopy(v, 6);

    printf("Initial Array:\n");
    Vector_print(vector);

    Sort_Insertion_Range((void*) vector->a, 0, 5, sizeof(Number), lessFunc,
                         print);

    printf("Sorted Array:\n");
    Vector_print(vector);

    Vector_destroy(vector);

#if DEBUG
    printf("Debug Flag is active!\n");
#endif

#if OS_WIN
    scanf("%d", &input);
#endif

    return 0;
}